

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O3

void EPD_DrawPolygon(pPoint Points,uint16_t PointCount,uint8_t color)

{
  long lVar1;
  
  if (1 < PointCount) {
    EPD_DrawLine(Points->X,Points->Y,Points[(ulong)PointCount - 1].X,Points[(ulong)PointCount - 1].Y
                 ,color);
    lVar1 = 0;
    do {
      EPD_DrawLine(Points[lVar1].X,Points[lVar1].Y,Points[lVar1 + 1].X,Points[lVar1 + 1].Y,color);
      lVar1 = lVar1 + 1;
    } while ((uint16_t)(PointCount - 1) != (short)lVar1);
  }
  return;
}

Assistant:

void EPD_DrawPolygon(pPoint Points,uint16_t PointCount,uint8_t color)
{
  uint16_t x = 0, y = 0;
  
  if(PointCount < 2)
  {
    return;
  }
  
  EPD_DrawLine(Points->X, Points->Y, (Points+PointCount-1)->X, (Points+PointCount-1)->Y,color);
  
  while(--PointCount)
  {
    x = Points->X;
    y = Points->Y;
    Points++;
    EPD_DrawLine(x, y, Points->X, Points->Y,color);
  }
}